

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_node_enum_optional(mpack_node_t node,char **strings,size_t count)

{
  char *__s;
  mpack_error_t mVar1;
  mpack_type_t mVar2;
  int iVar3;
  char *__s1;
  size_t __n;
  size_t sVar4;
  size_t otherlen;
  char *other;
  size_t i;
  size_t keylen;
  char *key;
  size_t count_local;
  char **strings_local;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if ((mVar1 == mpack_ok) && (mVar2 = mpack_node_type(node), mVar2 == mpack_type_str)) {
    __s1 = mpack_node_str(node);
    __n = mpack_node_strlen(node);
    mpack_node_error(node);
    for (other = (char *)0x0; other < count; other = other + 1) {
      __s = strings[(long)other];
      sVar4 = strlen(__s);
      if ((__n == sVar4) && (iVar3 = memcmp(__s1,__s,__n), iVar3 == 0)) {
        return (size_t)other;
      }
    }
  }
  return count;
}

Assistant:

size_t mpack_node_enum_optional(mpack_node_t node, const char* strings[], size_t count) {
    if (mpack_node_error(node) != mpack_ok)
        return count;

    // the value is only recognized if it is a string
    if (mpack_node_type(node) != mpack_type_str)
        return count;

    // fetch the string
    const char* key = mpack_node_str(node);
    size_t keylen = mpack_node_strlen(node);
    mpack_assert(mpack_node_error(node) == mpack_ok, "these should not fail");

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}